

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::CheckRewriteStringall(void)

{
  TestCheckRewriteString("abc","foo",true);
  TestCheckRewriteString("abc","foo\\",false);
  TestCheckRewriteString("abc","foo\\0bar",true);
  TestCheckRewriteString("a(b)c","foo",true);
  TestCheckRewriteString("a(b)c","foo\\0bar",true);
  TestCheckRewriteString("a(b)c","foo\\1bar",true);
  TestCheckRewriteString("a(b)c","foo\\2bar",false);
  TestCheckRewriteString("a(b)c","f\\\\2o\\1o",true);
  TestCheckRewriteString("a(b)(c)","foo\\12",true);
  TestCheckRewriteString("a(b)(c)","f\\2o\\1o",true);
  TestCheckRewriteString("a(b)(c)","f\\oo\\1",false);
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}